

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_diag_avx2_256_sat
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int in_stack_00000534;
  int in_stack_00000538;
  int in_stack_0000053c;
  char *in_stack_00000540;
  int in_stack_0000054c;
  char *in_stack_00000550;
  int in_stack_0000066c;
  int in_stack_00000670;
  int in_stack_00000674;
  char *in_stack_00000678;
  int in_stack_00000684;
  char *in_stack_00000688;
  int in_stack_00000874;
  int in_stack_00000878;
  int in_stack_0000087c;
  char *in_stack_00000880;
  int in_stack_0000088c;
  char *in_stack_00000890;
  parasail_matrix_t *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  local_38 = parasail_nw_rowcol_diag_avx2_256_8
                       (in_stack_00000890,in_stack_0000088c,in_stack_00000880,in_stack_0000087c,
                        in_stack_00000878,in_stack_00000874,in_stack_ffffffffffffffc0);
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_nw_rowcol_diag_avx2_256_16
                         (in_stack_00000688,in_stack_00000684,in_stack_00000678,in_stack_00000674,
                          in_stack_00000670,in_stack_0000066c,in_stack_ffffffffffffffc0);
  }
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_nw_rowcol_diag_avx2_256_32
                         (in_stack_00000550,in_stack_0000054c,in_stack_00000540,in_stack_0000053c,
                          in_stack_00000538,in_stack_00000534,in_stack_ffffffffffffffc0);
  }
  return local_38;
}

Assistant:

parasail_result_t* parasail_nw_rowcol_diag_avx2_256_sat(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
    parasail_result_t * result = NULL;

    result = parasail_nw_rowcol_diag_avx2_256_8(s1, s1Len, s2, s2Len, open, gap, matrix);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_nw_rowcol_diag_avx2_256_16(s1, s1Len, s2, s2Len, open, gap, matrix);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_nw_rowcol_diag_avx2_256_32(s1, s1Len, s2, s2Len, open, gap, matrix);
    }

    return result;
}